

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O2

void Abc_CexPrintStatsInputs(Abc_Cex_t *p,int nInputs)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  if (p == (Abc_Cex_t *)0x0) {
    puts("The counter example is NULL.");
    return;
  }
  if (p == (Abc_Cex_t *)0x1) {
    puts("The counter example is present but not available (pointer has value \"1\").");
    return;
  }
  uVar1 = p->nBits;
  uVar4 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  iVar5 = 0;
  iVar6 = 0;
  while( true ) {
    if (uVar2 == uVar4) break;
    iVar5 = iVar5 + (uint)(((uint)(&p[1].iPo)[uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0);
    iVar6 = iVar6 + ((uint)((int)(uVar4 - p->nRegs) % p->nPis < nInputs) &
                    (uint)(&p[1].iPo)[uVar4 >> 5] >> (sbyte)(uVar4 & 0x1f));
    uVar4 = uVar4 + 1;
  }
  iVar3 = uVar1 - p->nRegs;
  printf("CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%) 1sIn =%8d (%5.2f %%)\n"
         ,((double)iVar5 * 100.0) / (double)iVar3,
         ((double)iVar6 * 100.0) / (double)((nInputs - p->nPis) * (p->iFrame + 1) + iVar3),
         (ulong)(uint)p->iPo);
  return;
}

Assistant:

void Abc_CexPrintStatsInputs( Abc_Cex_t * p, int nInputs )
{
    int k, Counter = 0, Counter2 = 0;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return;
    }
    if ( p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
    {
        printf( "The counter example is present but not available (pointer has value \"1\").\n" );
        return;
    }
    for ( k = 0; k < p->nBits; k++ )
    {
        Counter += Abc_InfoHasBit(p->pData, k);
        if ( (k - p->nRegs) % p->nPis < nInputs )
            Counter2 += Abc_InfoHasBit(p->pData, k);
    }
    printf( "CEX: Po =%4d  Frame =%4d  FF = %d  PI = %d  Bit =%8d  1s =%8d (%5.2f %%) 1sIn =%8d (%5.2f %%)\n", 
        p->iPo, p->iFrame, p->nRegs, p->nPis, p->nBits, 
        Counter,  100.0 * Counter  / (p->nBits - p->nRegs), 
        Counter2, 100.0 * Counter2 / (p->nBits - p->nRegs - (p->iFrame + 1) * (p->nPis - nInputs)) );
}